

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_cigar2rlen(int n_cigar,uint32_t *cigar)

{
  int local_20;
  int local_1c;
  int l;
  int k;
  uint32_t *cigar_local;
  int n_cigar_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < n_cigar; local_1c = local_1c + 1) {
    if ((0x3c1a7 >> (sbyte)((cigar[local_1c] & 0xf) << 1) & 2U) != 0) {
      local_20 = (cigar[local_1c] >> 4) + local_20;
    }
  }
  return local_20;
}

Assistant:

int bam_cigar2rlen(int n_cigar, const uint32_t *cigar)
{
    int k, l;
    for (k = l = 0; k < n_cigar; ++k)
        if (bam_cigar_type(bam_cigar_op(cigar[k]))&2)
            l += bam_cigar_oplen(cigar[k]);
    return l;
}